

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  pointer pfVar1;
  pointer pfVar2;
  uint __line;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *__assertion;
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x40;
  }
  else if (i < A->m_) {
    pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar1;
    uVar4 = lVar3 >> 2;
    if (uVar4 == A->n_) {
      pfVar2 = (A->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar5 = 0; (~(lVar3 >> 0x3f) & uVar4) != uVar5; uVar5 = uVar5 + 1) {
        pfVar1[uVar5] = pfVar2[i * uVar4 + uVar5] + pfVar1[uVar5];
      }
      return;
    }
    __assertion = "size() == A.size(1)";
    __line = 0x42;
  }
  else {
    __assertion = "i < A.size(0)";
    __line = 0x41;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/vector.cc"
                ,__line,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  for (int64_t j = 0; j < A.size(1); j++) {
    data_[j] += A.at(i, j);
  }
}